

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

leaf_t * containerptr_roaring64_bitmap_remove
                   (roaring64_bitmap_t *r,uint8_t *high48,uint16_t low16,leaf_t *leaf)

{
  int iVar1;
  long lVar2;
  undefined8 in_RAX;
  int *c;
  art_val_t *__ptr;
  int *piVar3;
  ulong uVar4;
  uint8_t uVar5;
  ulong uVar6;
  bool bVar7;
  uint8_t typecode2;
  uint8_t local_31;
  
  local_31 = (uint8_t)((ulong)in_RAX >> 0x38);
  if (leaf != (leaf_t *)0x0) {
    piVar3 = (int *)leaf->container;
    uVar5 = leaf->typecode;
    c = (int *)container_remove(piVar3,low16,uVar5,&local_31);
    if (c != piVar3) {
      container_free(piVar3,uVar5);
      leaf->container = c;
      leaf->typecode = local_31;
    }
    piVar3 = c;
    uVar5 = local_31;
    if (local_31 == '\x04') {
      uVar5 = (uint8_t)c[2];
      piVar3 = *(int **)c;
    }
    iVar1 = *piVar3;
    if ((uVar5 == '\x03') || (uVar5 == '\x02')) {
      bVar7 = 0 < iVar1;
    }
    else {
      if (iVar1 == -1) {
        if (**(long **)(piVar3 + 2) == 0) {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 0x3fe) {
              uVar6 = 0x3ff;
              break;
            }
            uVar6 = uVar4 + 1;
            lVar2 = uVar4 + 2;
            uVar4 = uVar6;
          } while ((*(long **)(piVar3 + 2))[lVar2] == 0);
          bVar7 = 0x3fe < uVar6;
        }
        else {
          bVar7 = false;
        }
      }
      else {
        bVar7 = iVar1 == 0;
      }
      bVar7 = (bool)(bVar7 ^ 1);
    }
    if (bVar7) {
      return leaf;
    }
    container_free(c,local_31);
    __ptr = art_erase(&r->art,high48);
    if (__ptr != (art_val_t *)0x0) {
      roaring_free(__ptr);
    }
  }
  return (leaf_t *)0x0;
}

Assistant:

static inline leaf_t *containerptr_roaring64_bitmap_remove(
    roaring64_bitmap_t *r, uint8_t *high48, uint16_t low16, leaf_t *leaf) {
    if (leaf == NULL) {
        return NULL;
    }

    container_t *container = leaf->container;
    uint8_t typecode = leaf->typecode;
    uint8_t typecode2;
    container_t *container2 =
        container_remove(container, low16, typecode, &typecode2);
    if (container2 != container) {
        container_free(container, typecode);
        leaf->container = container2;
        leaf->typecode = typecode2;
    }
    if (!container_nonzero_cardinality(container2, typecode2)) {
        container_free(container2, typecode2);
        leaf = (leaf_t *)art_erase(&r->art, high48);
        if (leaf != NULL) {
            free_leaf(leaf);
        }
        return NULL;
    }
    return leaf;
}